

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

base_learner * log_multi_setup(options_i *options,vw *all)

{
  bool bVar1;
  byte bVar2;
  pointer plVar3;
  loss_function *plVar4;
  ulong uVar5;
  single_learner *this;
  learner<log_multi,_example> *this_00;
  long in_RSI;
  long *in_RDI;
  learner<log_multi,_example> *l;
  float loss_parameter;
  string loss_function;
  option_group_definition new_options;
  free_ptr<log_multi> data;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  vw *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  _func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<unsigned_int> *in_stack_fffffffffffffa20;
  learner<char,_example> *in_stack_fffffffffffffa28;
  learner<log_multi,_example> *f;
  prediction_type_t pred_type;
  typed_option<bool> *in_stack_fffffffffffffa58;
  option_group_definition *in_stack_fffffffffffffa60;
  log_multi *d;
  string local_4c8 [32];
  undefined4 local_4a8;
  allocator local_4a1;
  string local_4a0 [32];
  undefined4 local_480;
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  learner<char,_char> *in_stack_fffffffffffffbd0;
  string local_428 [68];
  float in_stack_fffffffffffffc1c;
  string *in_stack_fffffffffffffc20;
  vw *in_stack_fffffffffffffc28;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [199];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_int> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  long local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<log_multi>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Logarithmic Time Multiclass Tree",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa10,
             (string *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"log_multi",&local_159);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9328);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffa18,(uint *)in_stack_fffffffffffffa10)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Use online tree for multiclass",&local_181);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10,
             (string *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffffa60,(typed_option<unsigned_int> *)in_stack_fffffffffffffa58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"no_progress",&local_249);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a940f);
  VW::config::make_option<bool>(in_stack_fffffffffffffa18,(bool *)in_stack_fffffffffffffa10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"disable progressive validation",&local_271);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffa10,
             (string *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"swap_resistance",&local_339);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a94de);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffa18,(uint *)in_stack_fffffffffffffa10)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_fffffffffffffa20,(uint)((ulong)in_stack_fffffffffffffa18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"disable progressive validation",&local_361);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10,
             (string *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffffa60,(typed_option<unsigned_int> *)in_stack_fffffffffffffa58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"swap_resistance",(allocator *)&stack0xfffffffffffffbd7);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a95c9);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffa18,(uint *)in_stack_fffffffffffffa10)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_fffffffffffffa20,(uint)((ulong)in_stack_fffffffffffffa18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"higher = more resistance to swap, default=4",&local_451);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10,
             (string *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffffa60,(typed_option<unsigned_int> *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbd7);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffa10);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffa10);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_10)(local_10,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"log_multi",&local_479);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_478);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9bcc);
    bVar1 = plVar3->progress;
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9bdf);
    plVar3->progress = (bool)(~bVar1 & 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"quantile",&local_4a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    local_4a8 = 0x3f000000;
    d = *(log_multi **)(local_18 + 0x3548);
    if (d != (log_multi *)0x0) {
      (**(code **)(*(long *)d + 0x48))();
    }
    std::__cxx11::string::string(local_4c8,local_4a0);
    plVar4 = getLossFunction(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                             in_stack_fffffffffffffc1c);
    *(loss_function **)(local_18 + 0x3548) = plVar4;
    std::__cxx11::string::~string(local_4c8);
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9cd2);
    uVar5 = (ulong)(plVar3->k - 1);
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9ce5);
    plVar3->max_predictors = uVar5;
    std::unique_ptr<log_multi,_void_(*)(void_*)>::get
              ((unique_ptr<log_multi,_void_(*)(void_*)> *)in_stack_fffffffffffffa10);
    pred_type = (prediction_type_t)uVar5;
    init_tree(d);
    setup_base((options_i *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    this = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffa20 = *(typed_option<unsigned_int> **)(local_18 + 8);
    predict = (_func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
              ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x2a9d52);
    this_00 = LEARNER::init_multiclass_learner<log_multi,example,LEARNER::learner<char,example>>
                        ((free_ptr<log_multi> *)this,in_stack_fffffffffffffa28,
                         (_func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffa20,predict,(parser *)in_stack_fffffffffffffa10,
                         CONCAT44(in_stack_fffffffffffffa0c,4),pred_type);
    f = this_00;
    LEARNER::learner<log_multi,_example>::set_save_load(this_00,save_load_tree);
    LEARNER::learner<log_multi,_example>::set_finish
              ((learner<log_multi,_example> *)this,(_func_void_log_multi_ptr *)f);
    in_stack_fffffffffffffa10 = (vw *)LEARNER::make_base<log_multi,example>(this_00);
    local_480 = 1;
    local_8 = in_stack_fffffffffffffa10;
    std::__cxx11::string::~string(local_4a0);
  }
  else {
    local_8 = (vw *)0x0;
    local_480 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa10);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)in_stack_fffffffffffffa20);
  return (base_learner *)local_8;
}

Assistant:

base_learner* log_multi_setup(options_i& options, vw& all)  // learner setup
{
  auto data = scoped_calloc_or_throw<log_multi>();
  option_group_definition new_options("Logarithmic Time Multiclass Tree");
  new_options.add(make_option("log_multi", data->k).keep().help("Use online tree for multiclass"))
      .add(make_option("no_progress", data->progress).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist).default_value(4).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist)
               .default_value(4)
               .help("higher = more resistance to swap, default=4"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("log_multi"))
    return nullptr;

  data->progress = !data->progress;

  string loss_function = "quantile";
  float loss_parameter = 0.5;
  delete (all.loss);
  all.loss = getLossFunction(all, loss_function, loss_parameter);

  data->max_predictors = data->k - 1;
  init_tree(*data.get());

  learner<log_multi, example>& l = init_multiclass_learner(
      data, as_singleline(setup_base(options, all)), learn, predict, all.p, data->max_predictors);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}